

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_at_most_n.hpp
# Opt level: O2

tuple<std::_List_const_iterator<int>,_long,_int_*> *
burst::detail::copy_at_most_n_impl<std::_List_const_iterator<int>,long,int*>
          (tuple<std::_List_const_iterator<int>,_long,_int_*> *param_1,_List_node_base *first,
          _List_node_base *last,long n,int *result)

{
  long m;
  long lVar1;
  
  for (lVar1 = 0; (first != last && (0 < n + lVar1)); lVar1 = lVar1 + -1) {
    *result = *(int *)&first[1]._M_next;
    first = first->_M_next;
    result = result + 1;
  }
  (param_1->super__Tuple_impl<0UL,_std::_List_const_iterator<int>,_long,_int_*>).
  super__Tuple_impl<1UL,_long,_int_*>.super__Tuple_impl<2UL,_int_*>.
  super__Head_base<2UL,_int_*,_false>._M_head_impl = result;
  (param_1->super__Tuple_impl<0UL,_std::_List_const_iterator<int>,_long,_int_*>).
  super__Tuple_impl<1UL,_long,_int_*>.super__Head_base<1UL,_long,_false>._M_head_impl = -lVar1;
  (param_1->super__Tuple_impl<0UL,_std::_List_const_iterator<int>,_long,_int_*>).
  super__Head_base<0UL,_std::_List_const_iterator<int>,_false>._M_head_impl._M_node = first;
  return param_1;
}

Assistant:

std::tuple<InputIterator, Integral, OutputIterator>
            copy_at_most_n_impl
            (
                InputIterator first,
                InputIterator last,
                Integral n,
                OutputIterator result,
                std::input_iterator_tag
            )
        {
            auto m = n;
            while (first != last && m > 0)
            {
                *result = *first;

                ++first;
                ++result;
                --m;
            }

            return std::make_tuple(first, n - m, result);
        }